

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O2

bool __thiscall Debugger::StopDebugging(Debugger *this,JsRuntimeHandle runtime)

{
  code *pcVar1;
  JsErrorCode jsErrorCode;
  PAL_FILE *pPVar2;
  LPCWSTR pWVar3;
  bool bVar4;
  Debugger *local_28;
  void *callbackState;
  
  local_28 = (Debugger *)0x0;
  jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtDiagStopDebugging)(runtime,&local_28);
  if (jsErrorCode == JsNoError) {
    if (local_28 != this) {
      pPVar2 = PAL_get_stderr(0);
      PAL_fprintf(pPVar2,"ASSERTION (%s, line %d) %s %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/Debugger.cpp"
                  ,0x1af,"callbackState == this","callbackState == this");
      pPVar2 = PAL_get_stderr(0);
      PAL_fflush(pPVar2);
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    this->m_isDetached = true;
    bVar4 = true;
  }
  else {
    bVar4 = false;
    if (jsErrorCode != JsErrorDiagNotInDebugMode) {
      pPVar2 = PAL_get_stderr(0);
      pWVar3 = Helpers::JsErrorCodeToString(jsErrorCode);
      PAL_fwprintf(pPVar2,L"ERROR: errorCode failed. JsErrorCode=0x%x (%s)\n",(ulong)jsErrorCode,
                   pWVar3);
      pPVar2 = PAL_get_stderr(0);
      PAL_fflush(pPVar2);
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool Debugger::StopDebugging(JsRuntimeHandle runtime)
{
    void* callbackState = nullptr;

    JsErrorCode errorCode = ChakraRTInterface::JsDiagStopDebugging(runtime, &callbackState);

    if (errorCode == JsErrorCode::JsErrorDiagNotInDebugMode)
    {
        return false;
    }

    IfJsrtErrorFailLogAndRetFalse(errorCode);

    Assert(callbackState == this);

    this->m_isDetached = true;

    return true;
}